

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O1

void __thiscall FTextureManager::AddTiles(FTextureManager *this,void *tiles)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  WORD WVar8;
  FTextureID picnum;
  long lVar9;
  FBuildTexture *this_00;
  long lVar10;
  uint uVar11;
  int *piVar12;
  spriteframe_t *psVar13;
  DWORD speedrange;
  long lVar14;
  int iVar15;
  FTextureID FVar16;
  byte *pixels;
  byte bVar17;
  spriteframe_t rot;
  undefined8 local_88;
  int local_80 [4];
  int aiStack_70 [14];
  undefined2 local_38;
  
  bVar17 = 0;
  iVar3 = *(int *)((long)tiles + 8);
  iVar4 = *(int *)((long)tiles + 0xc);
  if (iVar3 <= iVar4) {
    lVar9 = (long)((iVar4 - iVar3) + 1);
    lVar6 = lVar9 * 2 + 0x10;
    lVar7 = lVar9 * 2 + lVar6;
    pixels = (byte *)((long)tiles + lVar9 * 4 + lVar7);
    lVar9 = (long)iVar3;
    do {
      lVar14 = lVar9 - iVar3;
      uVar1 = *(ushort *)((long)tiles + lVar14 * 2 + 0x10);
      if ((uVar1 != 0) && (uVar2 = *(ushort *)((long)tiles + lVar14 * 2 + lVar6), uVar2 != 0)) {
        uVar11 = *(uint *)((long)tiles + lVar14 * 4 + lVar7);
        local_88 = lVar9;
        this_00 = (FBuildTexture *)operator_new(0x68);
        lVar9 = local_88;
        FBuildTexture::FBuildTexture
                  (this_00,(int)local_88,pixels,(uint)uVar1,(uint)uVar2,
                   (uint)(uVar1 >> 1) + (int)(char)(uVar11 >> 8),
                   (uint)(uVar2 >> 1) + (int)(char)(uVar11 >> 0x10));
        iVar15 = (uint)uVar2 * (uint)uVar1;
        picnum = AddTexture(this,(FTexture *)this_00);
        if (iVar15 != 0) {
          iVar15 = iVar15 + 1;
          do {
            *pixels = ~*pixels;
            pixels = pixels + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        (*StartScreen->_vptr_FStartupScreen[2])();
        uVar5 = *(uint *)((long)tiles + lVar14 * 4 + lVar7);
        if (((uVar5 & 0x3f) != 0) && ((uVar5 & 0xc0) != 0)) {
          speedrange = (DWORD)((ulong)(uint)(1000 << ((byte)(uVar11 >> 0x18) & 0xf)) * 0x2222223 >>
                              0x20);
          if (speedrange < 2) {
            speedrange = 1;
          }
          AddSimpleAnim(this,picnum,uVar5 & 0x3f,
                        *(DWORD *)(&DAT_0061ba30 + (ulong)((uVar5 & 0xc0) >> 6) * 4),speedrange);
        }
        uVar11 = uVar11 >> 0x1c & 7;
        if (uVar11 == 2) {
          lVar14 = 8;
          FVar16 = picnum;
          do {
            FVar16.texnum = FVar16.texnum + 1;
            local_80[lVar14 * 2 + 1] = FVar16.texnum;
            local_80[lVar14 * 2] = FVar16.texnum;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 1);
          local_38 = 0;
          local_80[2] = picnum.texnum;
          local_80[3] = picnum.texnum;
        }
        else {
          if (uVar11 != 1) goto LAB_004fa14c;
          lVar14 = 0x44;
          lVar10 = 0;
          local_80[2] = picnum.texnum;
          local_80[3] = picnum.texnum;
          do {
            iVar15 = picnum.texnum + 1 + (int)lVar10;
            *(int *)((long)local_80 + lVar14) = iVar15;
            *(int *)((long)&local_88 + lVar14 + 4) = iVar15;
            local_80[lVar10 * 2 + 5] = iVar15;
            local_80[lVar10 * 2 + 4] = iVar15;
            lVar10 = lVar10 + 1;
            lVar14 = lVar14 + -8;
          } while (lVar10 != 3);
          aiStack_70[6] = picnum.texnum + 4;
          local_38 = 0xfc;
          aiStack_70[7] = aiStack_70[6];
        }
        local_80[0] = 0;
        local_80[1] = 0;
        TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,1);
        piVar12 = local_80;
        psVar13 = SpriteFrames.Array + SpriteFrames.Count;
        for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
          psVar13->Voxel = *(FVoxelDef **)piVar12;
          piVar12 = piVar12 + ((ulong)bVar17 * -2 + 1) * 2;
          psVar13 = (spriteframe_t *)((long)psVar13 + (ulong)bVar17 * -0x10 + 8);
        }
        WVar8 = (WORD)SpriteFrames.Count;
        SpriteFrames.Count = SpriteFrames.Count + 1;
        (this_00->super_FTexture).Rotations = WVar8;
      }
LAB_004fa14c:
      lVar9 = lVar9 + 1;
    } while (iVar4 + 1 != (int)lVar9);
  }
  return;
}

Assistant:

void FTextureManager::AddTiles (void *tiles)
{
//	int numtiles = LittleLong(((DWORD *)tiles)[1]);	// This value is not reliable
	int tilestart = LittleLong(((DWORD *)tiles)[2]);
	int tileend = LittleLong(((DWORD *)tiles)[3]);
	const WORD *tilesizx = &((const WORD *)tiles)[8];
	const WORD *tilesizy = &tilesizx[tileend - tilestart + 1];
	const DWORD *picanm = (const DWORD *)&tilesizy[tileend - tilestart + 1];
	BYTE *tiledata = (BYTE *)&picanm[tileend - tilestart + 1];

	for (int i = tilestart; i <= tileend; ++i)
	{
		int pic = i - tilestart;
		int width = LittleShort(tilesizx[pic]);
		int height = LittleShort(tilesizy[pic]);
		DWORD anm = LittleLong(picanm[pic]);
		int xoffs = (SBYTE)((anm >> 8) & 255) + width/2;
		int yoffs = (SBYTE)((anm >> 16) & 255) + height/2;
		int size = width*height;
		FTextureID texnum;
		FTexture *tex;

		if (width <= 0 || height <= 0) continue;

		tex = new FBuildTexture (i, tiledata, width, height, xoffs, yoffs);
		texnum = AddTexture (tex);
		while (size > 0)
		{
			*tiledata = 255 - *tiledata;
			tiledata++;
			size--;
		}
		StartScreen->Progress();

		if ((picanm[pic] & 63) && (picanm[pic] & 192))
		{
			int type, speed;

			switch (picanm[pic] & 192)
			{
			case 64:	type = 2;	break;
			case 128:	type = 0;	break;
			case 192:	type = 1;	break;
			default:    type = 0;   break;  // Won't happen, but GCC bugs me if I don't put this here.
			}

			speed = (anm >> 24) & 15;
			speed = MAX (1, (1 << speed) * 1000 / 120);	// Convert from 120 Hz to 1000 Hz.

			AddSimpleAnim (texnum, picanm[pic] & 63, type, speed);
		}

		// Blood's rotation types:
		// 0 - Single
		// 1 - 5 Full
		// 2 - 8 Full
		// 3 - Bounce (looks no different from Single; seems to signal bouncy sprites)
		// 4 - 5 Half (not used in game)
		// 5 - 3 Flat (not used in game)
		// 6 - Voxel
		// 7 - Spin Voxel

		int rotType = (anm >> 28) & 7;
		if (rotType == 1)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 4; ++j)
			{
				rot.Texture[j*2] =
				rot.Texture[j*2+1] =
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Texture[8] =
			rot.Texture[9] = texnum.GetIndex() + 4;
			rot.Flip = 0x00FC;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
		else if (rotType == 2)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 8; ++j)
			{
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Flip = 0;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
	}
}